

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

ssize_t writen(int fd,string *sbuff)

{
  ssize_t sVar1;
  int *piVar2;
  long lVar3;
  size_type __n;
  pointer __buf;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __n = sbuff->_M_string_length;
  if (__n == 0) {
    lVar3 = 0;
  }
  else {
    __buf = (sbuff->_M_dataplus)._M_p;
    lVar3 = 0;
    do {
      while (sVar1 = write(fd,__buf,__n), -1 < sVar1) {
        lVar3 = lVar3 + sVar1;
        __buf = __buf + sVar1;
        __n = __n - sVar1;
        if (__n == 0) goto LAB_00122534;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    if (*piVar2 != 0xb) {
      return -1;
    }
  }
LAB_00122534:
  if (lVar3 == (int)sbuff->_M_string_length) {
    sbuff->_M_string_length = 0;
    *(sbuff->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)sbuff);
    std::__cxx11::string::operator=((string *)sbuff,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return lVar3;
}

Assistant:

ssize_t writen(int fd, std::string &sbuff) {
  size_t nleft = sbuff.size();
  ssize_t nwritten = 0;
  ssize_t writeSum = 0;
  const char *ptr = sbuff.c_str();
  while (nleft > 0) {
    if ((nwritten = write(fd, ptr, nleft)) <= 0) {
      if (nwritten < 0) {
        if (errno == EINTR) {
          nwritten = 0;
          continue;
        } else if (errno == EAGAIN)
          break;
        else
          return -1;
      }
    }
    writeSum += nwritten;
    nleft -= nwritten;
    ptr += nwritten;
  }
  if (writeSum == static_cast<int>(sbuff.size()))
    sbuff.clear();
  else
    sbuff = sbuff.substr(writeSum);
  return writeSum;
}